

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::EncryptionAlgorithm::read
          (EncryptionAlgorithm *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ssize_t sVar6;
  short *__nbytes_00;
  void *__buf_00;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  int16_t fid;
  TType ftype;
  string fname;
  short local_6e;
  int local_6c;
  AesGcmV1 *local_68;
  AesGcmCtrV1 *local_60;
  EncryptionAlgorithm *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar2 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  local_60 = &this->AES_GCM_CTR_V1;
  local_68 = &this->AES_GCM_V1;
  local_58 = this;
  do {
    __nbytes_00 = &local_6e;
    iVar3 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_6c);
    if (local_6c == 0) {
      iVar4 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
      std::__cxx11::string::~string((string *)&local_50);
      this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
      return (ulong)(uint)(iVar4 + iVar3 + iVar2);
    }
    if (local_6e == 2) {
      if (local_6c != 0xc) goto LAB_00db60d2;
      sVar6 = AesGcmCtrV1::read(local_60,__fd,__buf_00,(size_t)__nbytes_00);
      iVar4 = (int)sVar6;
      bVar1 = 2;
LAB_00db60c5:
      local_58->__isset = (_EncryptionAlgorithm__isset)((byte)local_58->__isset | bVar1);
    }
    else {
      if ((local_6e == 1) && (local_6c == 0xc)) {
        sVar6 = AesGcmV1::read(local_68,__fd,__buf_00,(size_t)__nbytes_00);
        iVar4 = (int)sVar6;
        bVar1 = 1;
        goto LAB_00db60c5;
      }
LAB_00db60d2:
      iVar4 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
    }
    iVar5 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar2 = iVar4 + iVar3 + iVar2 + iVar5;
  } while( true );
}

Assistant:

uint32_t EncryptionAlgorithm::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    switch (fid)
    {
      case 1:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->AES_GCM_V1.read(iprot);
          this->__isset.AES_GCM_V1 = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      case 2:
        if (ftype == ::apache::thrift::protocol::T_STRUCT) {
          xfer += this->AES_GCM_CTR_V1.read(iprot);
          this->__isset.AES_GCM_CTR_V1 = true;
        } else {
          xfer += iprot->skip(ftype);
        }
        break;
      default:
        xfer += iprot->skip(ftype);
        break;
    }
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}